

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-handshake.c
# Opt level: O2

lws * lws_client_connect_4_established(lws *wsi,lws *wsi_piggyback,ssize_t plen)

{
  char cVar1;
  ushort uVar2;
  lws_context *plVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ssize_t sVar8;
  size_t len;
  lws_vhost_role_http *s;
  lws_wsi_state_t lrs;
  lws_vhost *plVar9;
  uchar **ppuVar10;
  undefined8 uVar11;
  char *__s;
  long lVar12;
  pollfd pfd;
  
  plVar3 = wsi->context;
  cVar1 = wsi->tsi;
  pcVar7 = lws_wsi_client_stash_item(wsi,5,0x5c);
  uVar11 = 0;
  bVar4 = true;
  if ((pcVar7 != (char *)0x0) &&
     ((iVar5 = strcmp(pcVar7,"RAW"), iVar5 == 0 || (iVar5 = strcmp(pcVar7,"MQTT"), iVar5 == 0)))) {
    uVar11 = 1;
    bVar4 = false;
  }
  if (wsi_piggyback == (lws *)0x0) {
    plVar9 = wsi->vhost;
    if ((plVar9->http).http_proxy_port != 0) {
      pcVar7 = lws_wsi_client_stash_item(wsi,0,0x58);
      __s = "";
      if (pcVar7 != (char *)0x0) {
        _lws_log(8,"%s: going via proxy\n","lws_client_connect_4_established");
        ppuVar10 = &plVar3->pt[cVar1].serv_buf;
        iVar5 = lws_snprintf((char *)*ppuVar10,0x100,
                             "CONNECT %s:%u HTTP/1.1\r\nHost: %s:%u\r\nUser-agent: lws\r\n",pcVar7,
                             (ulong)wsi->ocport,pcVar7,(ulong)wsi->ocport);
        lVar12 = (long)iVar5;
        if (wsi->vhost->proxy_basic_auth_token[0] != '\0') {
          iVar5 = lws_snprintf((char *)(*ppuVar10 + lVar12),0x100,
                               "Proxy-authorization: basic %s\r\n");
          lVar12 = lVar12 + iVar5;
        }
        iVar5 = lws_snprintf((char *)(*ppuVar10 + lVar12),5,"\r\n");
        s = &wsi->vhost->http;
        if (wsi->stash == (client_info_stash *)0x0) {
          iVar6 = lws_hdr_simple_create(wsi,_WSI_TOKEN_CLIENT_PEER_ADDRESS,s->http_proxy_address);
          if (iVar6 != 0) goto LAB_001247da;
        }
        else {
          wsi->stash->cis[0] = s->http_proxy_address;
        }
        wsi->c_port = (uint16_t)(wsi->vhost->http).http_proxy_port;
        sVar8 = send((wsi->desc).sockfd,*ppuVar10,(long)(iVar5 + (int)lVar12),0x4000);
        if ((int)sVar8 < 0) {
          _lws_log(0x10,"ERROR writing to proxy socket\n");
          __s = "proxy write failed";
          goto LAB_001247da;
        }
        lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_PROXY_RESPONSE,wsi->context->timeout_secs);
        lrs = 0x203;
        goto LAB_0012480d;
      }
      goto LAB_001247da;
    }
  }
  else {
    if ((wsi->dll2_cli_txn_queue).owner != (lws_dll2_owner *)0x0) {
      lwsi_set_state(wsi,0x10f);
      lws_callback_on_writable(wsi_piggyback);
      _lws_log(8,"%s: wsi %p: waiting to send hdrs (par state 0x%x)\n",
               "lws_client_connect_4_established",wsi,(ulong)(ushort)wsi_piggyback->wsistate);
      return wsi;
    }
    plVar9 = wsi->vhost;
  }
  _lws_log(8,"%s: wsi %p: %s %s client created own conn (raw %d) vh %s\n",
           "lws_client_connect_4_established",wsi,wsi->role_ops->name,wsi->protocol->name,uVar11,
           plVar9->name);
  if (bVar4) {
    lwsi_set_state(wsi,0x12);
    lws_set_timeout(wsi,PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE,wsi->context->timeout_secs);
    pfd.fd = (wsi->desc).sockfd;
    if (pfd.fd == -1) {
      __assert_fail("lws_socket_is_valid(wsi->desc.sockfd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/client/client-handshake.c"
                    ,0x134,
                    "struct lws *lws_client_connect_4_established(struct lws *, struct lws *, ssize_t)"
                   );
    }
    pfd.events = 1;
    pfd.revents = 1;
    iVar5 = lws_service_fd(wsi->context,&pfd);
    if (-1 < iVar5) {
      if (iVar5 != 0) {
        return (lws *)0x0;
      }
      return wsi;
    }
LAB_0012479f:
    __s = "first service failed";
  }
  else {
    if (((wsi->tls).use_ssl & 1) == 0) {
LAB_00124650:
      lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
      uVar2 = wsi->role_ops->adoption_cb[0];
      if ((uVar2 == 0) ||
         (iVar5 = user_callback_handle_rxflow
                            (wsi->protocol->callback,wsi,(uint)uVar2,wsi->user_space,(void *)0x0,0),
         -1 < iVar5)) {
        wsi->field_0x2dc = wsi->field_0x2dc | 1;
        iVar5 = strcmp(pcVar7,"MQTT");
        if (iVar5 != 0) {
          _lws_log(8,"%s: setting ESTABLISHED\n","lws_client_connect_4_established");
          lrs = 0x119;
LAB_0012480d:
          lwsi_set_state(wsi,lrs);
          return wsi;
        }
        if (((wsi->tls).use_ssl & 1) != 0) {
          lrs = 0x204;
          goto LAB_0012480d;
        }
        _lws_log(8,"%s: settings LRS_MQTTC_IDLE\n","lws_client_connect_4_established");
        lwsi_set_state(wsi,0x121);
        lws_set_timeout(wsi,PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE,0x14);
        pfd.fd = (wsi->desc).sockfd;
        if (pfd.fd == -1) {
          __assert_fail("lws_socket_is_valid(wsi->desc.sockfd)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/client/client-handshake.c"
                        ,0x10f,
                        "struct lws *lws_client_connect_4_established(struct lws *, struct lws *, ssize_t)"
                       );
        }
        pfd.events = 1;
        pfd.revents = 4;
        _lws_log(8,"%s: going to service fd\n","lws_client_connect_4_established");
        iVar5 = lws_service_fd(wsi->context,&pfd);
        if (-1 < iVar5) {
          if (iVar5 != 0) {
            return (lws *)0x0;
          }
          return wsi;
        }
        goto LAB_0012479f;
      }
      _lws_log(8,"LWS_CALLBACK_RAW_PROXY_CLI_ADOPT failed\n");
    }
    else {
      iVar5 = lws_ssl_client_bio_create(wsi);
      if (-1 < iVar5) {
        if (((wsi->tls).use_ssl & 1) != 0) {
          iVar5 = lws_ssl_client_connect1(wsi);
          if (iVar5 == 0) {
            return wsi;
          }
          if (iVar5 < 0) {
            pcVar7 = "%s: lws_ssl_client_connect1 failed\n";
            goto LAB_001247af;
          }
        }
        goto LAB_00124650;
      }
      pcVar7 = "%s: bio_create failed\n";
LAB_001247af:
      _lws_log(1,pcVar7,"lws_client_connect_4_established");
    }
    __s = "";
  }
LAB_001247da:
  len = strlen(__s);
  lws_inform_client_conn_fail(wsi,__s,len);
  lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"client_connect2");
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_connect_4_established(struct lws *wsi, struct lws *wsi_piggyback,
				 ssize_t plen)
{
#if defined(LWS_CLIENT_HTTP_PROXYING)
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
#endif
	const char *meth;
	struct lws_pollfd pfd;
	const char *cce = "";
	int n, m, rawish = 0;

	meth = lws_wsi_client_stash_item(wsi, CIS_METHOD,
					 _WSI_TOKEN_CLIENT_METHOD);

	if (meth && (!strcmp(meth, "RAW")
#if defined(LWS_ROLE_MQTT)
		     || !strcmp(meth, "MQTT")
#endif
	))
		rawish = 1;

	if (wsi_piggyback)
		goto send_hs;

#if defined(LWS_CLIENT_HTTP_PROXYING)
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	/* we are connected to server, or proxy */

	/* http proxy */
	if (wsi->vhost->http.http_proxy_port) {
		const char *cpa;

		cpa = lws_wsi_client_stash_item(wsi, CIS_ADDRESS,
						_WSI_TOKEN_CLIENT_PEER_ADDRESS);
		if (!cpa)
			goto failed;

		lwsl_info("%s: going via proxy\n", __func__);

		plen = lws_snprintf((char *)pt->serv_buf, 256,
			"CONNECT %s:%u HTTP/1.1\x0d\x0a"
			"Host: %s:%u\x0d\x0a"
			"User-agent: lws\x0d\x0a", cpa, wsi->ocport,
						   cpa, wsi->ocport);

		if (wsi->vhost->proxy_basic_auth_token[0])
			plen += lws_snprintf((char *)pt->serv_buf + plen, 256,
					"Proxy-authorization: basic %s\x0d\x0a",
					wsi->vhost->proxy_basic_auth_token);

		plen += lws_snprintf((char *)pt->serv_buf + plen, 5, "\x0d\x0a");

		/* lwsl_hexdump_notice(pt->serv_buf, plen); */

		/*
		 * OK from now on we talk via the proxy, so connect to that
		 */
		if (wsi->stash)
			wsi->stash->cis[CIS_ADDRESS] =
				wsi->vhost->http.http_proxy_address;
		else
			if (lws_hdr_simple_create(wsi,
					_WSI_TOKEN_CLIENT_PEER_ADDRESS,
					  wsi->vhost->http.http_proxy_address))
			goto failed;
		wsi->c_port = wsi->vhost->http.http_proxy_port;

		n = send(wsi->desc.sockfd, (char *)pt->serv_buf, (int)plen,
			 MSG_NOSIGNAL);
		if (n < 0) {
			lwsl_debug("ERROR writing to proxy socket\n");
			cce = "proxy write failed";
			goto failed;
		}

		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_PROXY_RESPONSE,
				wsi->context->timeout_secs);

		lwsi_set_state(wsi, LRS_WAITING_PROXY_REPLY);

		return wsi;
	}
#endif
#endif

#if defined(LWS_WITH_SOCKS5)
	switch (lws_socks5c_greet(wsi, &cce)) {
	case -1:
		goto failed;
	case 1:
		return wsi;
	default:
		break;
	}
#endif

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
send_hs:

	if (wsi_piggyback &&
	    !lws_dll2_is_detached(&wsi->dll2_cli_txn_queue)) {
		/*
		 * We are pipelining on an already-established connection...
		 * we can skip tls establishment.
		 *
		 * Set these queued guys to a state where they won't actually
		 * send their headers until we decide later.
		 */

		lwsi_set_state(wsi, LRS_H2_WAITING_TO_SEND_HEADERS);

		/*
		 * we can't send our headers directly, because they have to
		 * be sent when the parent is writeable.  The parent will check
		 * for anybody on his client transaction queue that is in
		 * LRS_H1C_ISSUE_HANDSHAKE2, and let them write.
		 *
		 * If we are trying to do this too early, before the master
		 * connection has written his own headers, then it will just
		 * wait in the queue until it's possible to send them.
		 */
		lws_callback_on_writable(wsi_piggyback);
#if defined(LWS_WITH_DETAILED_LATENCY)
		wsi->detlat.earliest_write_req =
			wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif
		lwsl_info("%s: wsi %p: waiting to send hdrs (par state 0x%x)\n",
			    __func__, wsi, lwsi_state(wsi_piggyback));
	} else {
		lwsl_info("%s: wsi %p: %s %s client created own conn (raw %d) vh %s\n",
			    __func__, wsi, wsi->role_ops->name,
			    wsi->protocol->name, rawish, wsi->vhost->name);

		/* we are making our own connection */
		if (!rawish)
			lwsi_set_state(wsi, LRS_H1C_ISSUE_HANDSHAKE);
		else {
			/* for a method = "RAW" connection, this makes us
			 * established */

#if defined(LWS_WITH_TLS)
			if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {

				/* we can retry this... just cook the SSL BIO the first time */

				if (lws_ssl_client_bio_create(wsi) < 0) {
					lwsl_err("%s: bio_create failed\n", __func__);
					goto failed;
				}

	//#if !defined(LWS_WITH_SYS_ASYNC_DNS)
				if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
					n = lws_ssl_client_connect1(wsi);
					if (!n)
						return wsi;
					if (n < 0) {
						lwsl_err("%s: lws_ssl_client_connect1 failed\n", __func__);
						goto failed;
					}
				}
	//#endif
			}
#endif

#if 0
#if defined(LWS_WITH_SYS_ASYNC_DNS)
			if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
				n = lws_ssl_client_connect1(wsi);
				if (n < 0) {
					lwsl_err("%s: lws_ssl_client_connect1 failed\n", __func__);
					goto failed;
				}
			}
#endif
#endif

			/* clear his established timeout */
			lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

			m = wsi->role_ops->adoption_cb[0];
			if (m) {
				n = user_callback_handle_rxflow(
						wsi->protocol->callback, wsi,
						m, wsi->user_space, NULL, 0);
				if (n < 0) {
					lwsl_info("LWS_CALLBACK_RAW_PROXY_CLI_ADOPT failed\n");
					goto failed;
				}
			}

			/* service.c pollout processing wants this */
			wsi->hdr_parsing_completed = 1;
#if defined(LWS_ROLE_MQTT)
			if (!strcmp(meth, "MQTT")) {
#if defined(LWS_WITH_TLS)
				if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
					lwsi_set_state(wsi, LRS_WAITING_SSL);
					return wsi;
				}
#endif
				lwsl_info("%s: settings LRS_MQTTC_IDLE\n",
					  __func__);
				lwsi_set_state(wsi, LRS_MQTTC_IDLE);

				/*
				 * provoke service to issue the CONNECT directly.
				 */
				lws_set_timeout(wsi, PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE,
						AWAITING_TIMEOUT);

				assert(lws_socket_is_valid(wsi->desc.sockfd));

				pfd.fd = wsi->desc.sockfd;
				pfd.events = LWS_POLLIN;
				pfd.revents = LWS_POLLOUT;

				lwsl_info("%s: going to service fd\n", __func__);
				n = lws_service_fd(wsi->context, &pfd);
				if (n < 0) {
					cce = "first service failed";
					goto failed;
				}
				if (n) /* returns 1 on failure after closing wsi */
					return NULL;
				return wsi;
			}
#endif
			lwsl_info("%s: setting ESTABLISHED\n", __func__);
			lwsi_set_state(wsi, LRS_ESTABLISHED);

			return wsi;
		}

		/*
		 * provoke service to issue the handshake directly.
		 *
		 * we need to do it this way because in the proxy case, this is
		 * the next state and executed only if and when we get a good
		 * proxy response inside the state machine... but notice in
		 * SSL case this may not have sent anything yet with 0 return,
		 * and won't until many retries from main loop.  To stop that
		 * becoming endless, cover with a timeout.
		 */

		lws_set_timeout(wsi, PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE,
				wsi->context->timeout_secs);

		assert(lws_socket_is_valid(wsi->desc.sockfd));

		pfd.fd = wsi->desc.sockfd;
		pfd.events = LWS_POLLIN;
		pfd.revents = LWS_POLLIN;

		n = lws_service_fd(wsi->context, &pfd);
		if (n < 0) {
			cce = "first service failed";
			goto failed;
		}
		if (n) /* returns 1 on failure after closing wsi */
			return NULL;
	}
#endif
	return wsi;

failed:
	lws_inform_client_conn_fail(wsi, (void *)cce, strlen(cce));

	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "client_connect2");

	return NULL;
}